

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::handleConnection(WebServer *this)

{
  int iVar1;
  element_type *peVar2;
  ostream *this_00;
  socklen_t *in_RCX;
  sockaddr *__addr;
  long in_RDI;
  epoll_event event;
  shared_ptr<TimerNode> timerNode;
  CbTask cbtask;
  shared_ptr<HttpData> httpData;
  shared_ptr<ClientSocket> clientSocket_ptr;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  CbTask *in_stack_fffffffffffffec0;
  offset_in_WebServer_to_subr *in_stack_fffffffffffffec8;
  _Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
  *in_stack_fffffffffffffed8;
  TimerManager *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  HttpData *in_stack_fffffffffffffef0;
  offset_in_WebServer_to_subr local_d8 [2];
  __uint32_t local_c4;
  int local_c0;
  code *local_a0;
  undefined8 local_98;
  _Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)> local_18;
  
  std::make_shared<ClientSocket>();
  while( true ) {
    peVar2 = std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffec0);
    iVar1 = ServerSocket::accept((ServerSocket *)(in_RDI + 0x10),(int)peVar2,__addr,in_RCX);
    if (iVar1 < 1) break;
    std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x116b21);
    setNonBlocking((int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    std::make_shared<HttpData>();
    std::__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x116b46);
    std::shared_ptr<ClientSocket>::shared_ptr
              ((shared_ptr<ClientSocket> *)in_stack_fffffffffffffec0,
               (shared_ptr<ClientSocket> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    HttpData::setClientSocket
              (in_stack_fffffffffffffef0,
               (shared_ptr<ClientSocket> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::shared_ptr<ClientSocket>::~shared_ptr((shared_ptr<ClientSocket> *)0x116b83);
    CbTask::CbTask(in_stack_fffffffffffffec0);
    local_a0 = cbfunc;
    local_98 = 0;
    std::bind<void(WebServer::*)(std::shared_ptr<void>),WebServer*,std::_Placeholder<1>const&>
              (in_stack_fffffffffffffec8,(WebServer **)in_stack_fffffffffffffec0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::function<void(std::shared_ptr<void>)>::operator=
              ((function<void_(std::shared_ptr<void>)> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    std::shared_ptr<void>::operator=
              ((shared_ptr<void> *)in_stack_fffffffffffffec0,
               (shared_ptr<HttpData> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
              );
    std::make_shared<TimerNode,unsigned_long&,CbTask&>
              ((unsigned_long *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (CbTask *)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffef0 = (HttpData *)(in_RDI + 0x58);
    std::__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x116c43);
    std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x116c4f);
    std::
    unordered_map<int,_std::shared_ptr<HttpData>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>_>
    ::operator[]((unordered_map<int,_std::shared_ptr<HttpData>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>_>
                  *)in_stack_fffffffffffffec0,
                 (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::shared_ptr<HttpData>::operator=
              ((shared_ptr<HttpData> *)in_stack_fffffffffffffec0,
               (shared_ptr<HttpData> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
              );
    local_c4 = Epoll::DEFAULT_EVENT;
    in_stack_fffffffffffffed8 = &local_18;
    peVar2 = std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x116c97);
    local_c0 = peVar2->fd_;
    in_stack_fffffffffffffee0 = *(TimerManager **)(in_RDI + 0x48);
    std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x116cbb);
    in_RCX = &local_c4;
    in_stack_fffffffffffffeec =
         Epoll::modFd((Epoll *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                      in_stack_fffffffffffffeb8,(epoll_event *)0x116cd4);
    if (in_stack_fffffffffffffeec == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"add listen socket success");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    in_stack_fffffffffffffec0 = *(CbTask **)(in_RDI + 0x50);
    in_stack_fffffffffffffec8 = local_d8;
    std::shared_ptr<TimerNode>::shared_ptr
              ((shared_ptr<TimerNode> *)in_stack_fffffffffffffec0,
               (shared_ptr<TimerNode> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    TimerManager::addTimerNode
              (in_stack_fffffffffffffee0,(shared_ptr<TimerNode> *)in_stack_fffffffffffffed8);
    std::shared_ptr<TimerNode>::~shared_ptr((shared_ptr<TimerNode> *)0x116dc8);
    std::shared_ptr<TimerNode>::~shared_ptr((shared_ptr<TimerNode> *)0x116dd5);
    CbTask::~CbTask(in_stack_fffffffffffffec0);
    std::shared_ptr<HttpData>::~shared_ptr((shared_ptr<HttpData> *)0x116def);
  }
  std::shared_ptr<ClientSocket>::~shared_ptr((shared_ptr<ClientSocket> *)0x116e48);
  return;
}

Assistant:

void WebServer::handleConnection()
{
    /*因为ET模式，记得把socket设置为非阻塞的*/
    std::shared_ptr<ClientSocket> clientSocket_ptr = std::make_shared<ClientSocket>();
    while (serverSocket_.accept(*clientSocket_ptr) > 0)
    {
        /* 设置为非阻塞 */
        setNonBlocking(clientSocket_ptr->fd_); 

        /* 初始化httpData */
        std::shared_ptr<HttpData> httpData = std::make_shared<HttpData>();
        httpData->setClientSocket(clientSocket_ptr);
        /* 初始化timerNode */
        CbTask cbtask;
        cbtask.function = std::bind(&WebServer::cbfunc, this, std::placeholders::_1);
        cbtask.arg = httpData;
        std::shared_ptr<TimerNode> timerNode = std::make_shared<TimerNode>(TimerNode::DEFAULT_INTERVAL_SEC,cbtask);

        /* 将httpData 保存到Map中 */
        this->httpDataMap_[httpData->sharedPtr_clientSocket->fd_] = httpData;

        /* 添加对应的监听事件 */
        struct epoll_event event;
        event.events = Epoll::DEFAULT_EVENT;
        event.data.fd = clientSocket_ptr->fd_;

        if (epoll_->modFd(EPOLL_CTL_ADD, clientSocket_ptr->fd_, &event))
        {

            // std::cout << "add listen socket " << clientSocket_ptr->fd_ << std::endl;
        }
        else
        {
            std::cout << "add listen socket success" << std::endl;
        }

        /* 添加定时器 */
        timerManager->addTimerNode(timerNode);
    }
}